

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetCreateRuleVariable
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  bool bVar5;
  long *plVar6;
  char *pcVar7;
  size_type *psVar8;
  ulong *puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  string var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(this->Target->TargetTypeValue) {
  case EXECUTABLE:
    std::operator+(&local_70,"CMAKE_",lang);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    break;
  case STATIC_LIBRARY:
    std::operator+(&local_50,"CMAKE_",lang);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    paVar2 = &local_70.field_2;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar9) {
      local_70.field_2._M_allocated_capacity = *puVar9;
      local_70.field_2._8_8_ = plVar6[3];
      local_70._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *puVar9;
      local_70._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_70._M_string_length = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"INTERPROCEDURAL_OPTIMIZATION","");
    pcVar7 = GetFeature(this,&local_50,config);
    bVar5 = cmSystemTools::IsOn(pcVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      paVar1 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_70._M_dataplus._M_p,
                 local_70._M_dataplus._M_p + local_70._M_string_length);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar7 = cmMakefile::GetDefinition(this->Makefile,__return_storage_ptr__);
      if (pcVar7 == (char *)0x0) {
        pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        goto LAB_003e1753;
      }
    }
    else {
LAB_003e1753:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == paVar2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_70.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_70.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_70._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_70.field_2._M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = local_70._M_string_length;
      local_70._M_string_length = 0;
      local_70.field_2._M_allocated_capacity =
           local_70.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_70._M_dataplus._M_p = (pointer)paVar2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar2) {
      return __return_storage_ptr__;
    }
    goto LAB_003e17a0;
  case SHARED_LIBRARY:
    std::operator+(&local_70,"CMAKE_",lang);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    break;
  case MODULE_LIBRARY:
    std::operator+(&local_70,"CMAKE_",lang);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar8) {
    lVar4 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_003e17a0:
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmGeneratorTarget::GetCreateRuleVariable(std::string const& lang,
                                         std::string const& config) const
{
  switch(this->GetType())
    {
    case cmState::STATIC_LIBRARY:
      {
      std::string var = "CMAKE_" + lang + "_CREATE_STATIC_LIBRARY";
      if(this->GetFeatureAsBool(
           "INTERPROCEDURAL_OPTIMIZATION", config))
        {
        std::string varIPO = var + "_IPO";
        if(this->Makefile->GetDefinition(varIPO))
          {
          return varIPO;
          }
        }
      return var;
      }
    case cmState::SHARED_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_LIBRARY";
    case cmState::MODULE_LIBRARY:
      return "CMAKE_" + lang + "_CREATE_SHARED_MODULE";
    case cmState::EXECUTABLE:
      return "CMAKE_" + lang + "_LINK_EXECUTABLE";
    default:
      break;
    }
  return "";
}